

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void Logger::log_success(string *message,bool newline)

{
  undefined7 in_register_00000031;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&instance,"\x1b[0;32m",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&instance,"[!] ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&instance,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&instance,"\x1b[0m",4);
  if ((int)CONCAT71(in_register_00000031,newline) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&instance,"\n",1);
    return;
  }
  return;
}

Assistant:

void Logger::log_success(const std::string &message, bool newline) {
  instance.logfile << FC_GREEN << "[!] " << message;
  instance.logfile << F_RESET;
  if (newline) instance.logfile << "\n";
}